

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

char * ParsePast(char *token,char *s)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  
  if (token == (char *)0x0) {
    return (char *)0x0;
  }
  cVar5 = *token;
  if (((' ' < cVar5) && (pcVar1 = ParsePastWhiteSpace(s), pcVar1 != (char *)0x0)) &&
     (cVar2 = *pcVar1, ' ' < cVar2)) {
    while( true ) {
      token = token + 1;
      cVar3 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar3 = cVar2;
      }
      cVar4 = cVar5 + -0x20;
      if (0x19 < (byte)(cVar5 + 0x9fU)) {
        cVar4 = cVar5;
      }
      if (cVar3 != cVar4) break;
      if (cVar2 == '\0') {
        return pcVar1;
      }
      cVar2 = pcVar1[1];
      pcVar1 = pcVar1 + 1;
      cVar5 = *token;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* ParsePast(const char* token, const char* s)
{
  if (0 == token || token[0] <= 32)
    return 0;

  s = ParsePastWhiteSpace(s);
  if (0 == s || s[0] <= 32)
    return 0;

  for (/*empty init*/; ToUpper(*s) == ToUpper(*token); s++, token++)
  {
    if (0 == *s)
      return s;
  }
  return 0;
}